

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

Node * __thiscall
wasm::DataFlow::Graph::makeZeroComp(Graph *this,Node *node,bool equal,Expression *origin)

{
  bool bVar1;
  BinaryOp op;
  Node *node_00;
  Expression *left;
  Expression *right;
  Binary *expr_00;
  Node *pNVar2;
  Op op_00;
  Node *check;
  Binary *expr;
  Node *zero;
  Type type;
  Builder builder;
  Expression *origin_local;
  bool equal_local;
  Node *node_local;
  Graph *this_local;
  
  bVar1 = Node::isBad(node);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    Builder::Builder((Builder *)&type,this->module);
    zero = (Node *)Node::getWasmType(node);
    bVar1 = wasm::Type::isConcrete((Type *)&zero);
    this_local = this;
    if (bVar1) {
      node_00 = makeZero(this,(Type)zero);
      op_00 = Ne;
      if (equal) {
        op_00 = Eq;
      }
      op = Abstract::getBinary((Type)zero,op_00);
      left = makeUse(this,node);
      right = makeUse(this,node_00);
      expr_00 = Builder::makeBinary((Builder *)&type,op,left,right);
      pNVar2 = Node::makeExpr((Expression *)expr_00,origin);
      this_local = (Graph *)addNode(this,pNVar2);
      pNVar2 = expandFromI1(this,node,origin);
      Node::addValue((Node *)this_local,pNVar2);
      Node::addValue((Node *)this_local,node_00);
    }
    return &this_local->bad;
  }
  __assert_fail("!node->isBad()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/dataflow/graph.h"
                ,0xa7,"Node *wasm::DataFlow::Graph::makeZeroComp(Node *, bool, Expression *)");
}

Assistant:

Node* makeZeroComp(Node* node, bool equal, Expression* origin) {
    assert(!node->isBad());
    Builder builder(*module);
    auto type = node->getWasmType();
    if (!type.isConcrete()) {
      return &bad;
    }
    auto* zero = makeZero(type);
    auto* expr = builder.makeBinary(
      Abstract::getBinary(type, equal ? Abstract::Eq : Abstract::Ne),
      makeUse(node),
      makeUse(zero));
    auto* check = addNode(Node::makeExpr(expr, origin));
    check->addValue(expandFromI1(node, origin));
    check->addValue(zero);
    return check;
  }